

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

int8 * rw::ps2::getADCbits(Geometry *geo)

{
  long lVar1;
  
  lVar1 = (long)adcOffset;
  if ((lVar1 != 0) && (*(int *)((long)geo->texCoords + lVar1 + -0x38) != 0)) {
    return *(int8 **)((long)geo->texCoords + lVar1 + -0x30);
  }
  return (int8 *)0x0;
}

Assistant:

int8*
getADCbits(Geometry *geo)
{
	int8 *bits = nil;
	if(adcOffset){
		ADCData *adc = PLUGINOFFSET(ADCData, geo, adcOffset);
		if(adc->adcFormatted)
			bits = adc->adcBits;
	}
	return bits;
}